

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_reduce(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
          *this)

{
  bool bVar1;
  Index IVar2;
  Dimension dim;
  Bar_dictionary *this_00;
  uint local_14;
  Index i;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *this_local;
  
  this_00 = _indexToBar(this);
  IVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
          ::get_number_of_columns(&this->reducedMatrixR_);
  std::
  unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
  ::reserve(this_00,(ulong)IVar2);
  local_14 = 0;
  while( true ) {
    IVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            ::get_number_of_columns(&this->reducedMatrixR_);
    if (IVar2 <= local_14) break;
    bVar1 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            ::is_zero_column(&this->reducedMatrixR_,local_14);
    if (bVar1) {
      dim = get_column_dimension(this,local_14);
      _add_bar(this,dim,local_14);
    }
    else {
      _reduce_column(this,local_14,local_14);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce()
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(reducedMatrixR_.get_number_of_columns());
  }

  for (Index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if (!(reducedMatrixR_.is_zero_column(i))) {
      _reduce_column(i, i);
    } else {
      _add_bar(get_column_dimension(i), i);
    }
  }
}